

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest12::testImageDraw
          (FunctionalTest12 *this,GLuint subroutine_index,texture *left,texture *right,
          GLuint *expected_left_color,GLuint *expected_right_color)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  MessageBuilder local_358;
  MessageBuilder local_1c8;
  byte local_41;
  long lStack_40;
  bool result;
  Functions *gl;
  GLuint *expected_right_color_local;
  GLuint *expected_left_color_local;
  texture *right_local;
  texture *left_local;
  FunctionalTest12 *pFStack_10;
  GLuint subroutine_index_local;
  FunctionalTest12 *this_local;
  
  gl = (Functions *)expected_right_color;
  expected_right_color_local = expected_left_color;
  expected_left_color_local = &right->m_id;
  right_local = left;
  left_local._4_4_ = subroutine_index;
  pFStack_10 = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_40 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lStack_40 + 0x1668))(0x8b30,1,(long)&left_local + 4);
  dVar3 = (**(code **)(lStack_40 + 0x800))();
  glu::checkError(dVar3,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x18a9);
  (**(code **)(lStack_40 + 0x14f0))(this->m_left_image,0);
  dVar3 = (**(code **)(lStack_40 + 0x800))();
  glu::checkError(dVar3,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x18ad);
  (**(code **)(lStack_40 + 0x14f0))(this->m_right_image,1);
  dVar3 = (**(code **)(lStack_40 + 0x800))();
  glu::checkError(dVar3,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x18b0);
  (**(code **)(lStack_40 + 0x80))(0,right_local->m_id,0,0,0,0x88ba,0x8d70);
  dVar3 = (**(code **)(lStack_40 + 0x800))();
  glu::checkError(dVar3,"BindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x18b3);
  (**(code **)(lStack_40 + 0x80))(1,*expected_left_color_local,0,0,0,0x88ba,0x8d70);
  dVar3 = (**(code **)(lStack_40 + 0x800))();
  glu::checkError(dVar3,"BindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x18b6);
  (**(code **)(lStack_40 + 0x538))(0,0,1);
  dVar3 = (**(code **)(lStack_40 + 0x800))();
  glu::checkError(dVar3,"DrawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x18ba);
  local_41 = 1;
  bVar1 = verifyTexture(this,right_local,expected_right_color_local);
  if (!bVar1) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_1c8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_1c8,
                        (char (*) [64])
                        "Error. Invalid result. Left texture is filled with wrong color.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    local_41 = 0;
  }
  bVar1 = verifyTexture(this,(texture *)expected_left_color_local,(GLuint *)gl);
  if (!bVar1) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_358,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_358,
                        (char (*) [65])
                        "Error. Invalid result. Right texture is filled with wrong color.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
    local_41 = 0;
  }
  return (bool)(local_41 & 1);
}

Assistant:

bool FunctionalTest12::testImageDraw(GLuint subroutine_index, Utils::texture& left, Utils::texture& right,
									 const GLuint expected_left_color[4], const GLuint expected_right_color[4]) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set subroutine uniforms */
	gl.uniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1, &subroutine_index);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Set up image units */
	gl.uniform1i(m_left_image, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

	gl.uniform1i(m_right_image, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

	gl.bindImageTexture(0, left.m_id, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32UI);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

	gl.bindImageTexture(1, right.m_id, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32UI);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

	/* Draw */
	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

	/* Verify results */
	bool result = true;

	if (false == verifyTexture(left, expected_left_color))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Error. Invalid result. Left texture is filled with wrong color."
											<< tcu::TestLog::EndMessage;
		result = false;
	}

	if (false == verifyTexture(right, expected_right_color))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Error. Invalid result. Right texture is filled with wrong color."
											<< tcu::TestLog::EndMessage;
		result = false;
	}

	/* Done */
	return result;
}